

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CS248::HalfedgeMesh::rebuild
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_> *vertexPositions)

{
  list<CS248::Edge,_std::allocator<CS248::Edge>_> *in_RDI;
  vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_> *in_stack_00000680;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_00000688;
  HalfedgeMesh *in_stack_00000690;
  
  std::__cxx11::list<CS248::Halfedge,_std::allocator<CS248::Halfedge>_>::clear
            ((list<CS248::Halfedge,_std::allocator<CS248::Halfedge>_> *)in_RDI);
  std::__cxx11::list<CS248::Vertex,_std::allocator<CS248::Vertex>_>::clear
            ((list<CS248::Vertex,_std::allocator<CS248::Vertex>_> *)in_RDI);
  std::__cxx11::list<CS248::Edge,_std::allocator<CS248::Edge>_>::clear(in_RDI);
  std::__cxx11::list<CS248::Face,_std::allocator<CS248::Face>_>::clear
            ((list<CS248::Face,_std::allocator<CS248::Face>_> *)in_RDI);
  std::__cxx11::list<CS248::Face,_std::allocator<CS248::Face>_>::clear
            ((list<CS248::Face,_std::allocator<CS248::Face>_> *)in_RDI);
  build(in_stack_00000690,in_stack_00000688,in_stack_00000680);
  return;
}

Assistant:

void HalfedgeMesh::rebuild(const vector<vector<Index> >& polygons,
                           const vector<Vector3D>& vertexPositions) {
  // Clear old elements
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Create new mesh
  build(polygons, vertexPositions);
}